

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O1

type __thiscall
fmt::v5::internal::
arg_converter<unsigned_long,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
::operator()(arg_converter<unsigned_long,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
             *this,char value)

{
  basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  *pbVar1;
  type tVar2;
  
  if ((this->type_ == 'i') || (this->type_ == 'd')) {
    pbVar1 = this->arg_;
    (pbVar1->value_).field_0.pointer =
         (void *)((ulong)CONCAT14(-1 < value,(int)value) - 0x100000000);
    tVar2 = long_long_type;
  }
  else {
    pbVar1 = this->arg_;
    *(ulong *)&(pbVar1->value_).field_0 = (ulong)(byte)value;
    tVar2 = uint_type;
  }
  pbVar1->type_ = tVar2;
  return;
}

Assistant:

typename std::enable_if<std::is_integral<U>::value>::type
      operator()(U value) {
    bool is_signed = type_ == 'd' || type_ == 'i';
    typedef typename std::conditional<
        std::is_same<T, void>::value, U, T>::type TargetType;
    if (const_check(sizeof(TargetType) <= sizeof(int))) {
      // Extra casts are used to silence warnings.
      if (is_signed) {
        arg_ = internal::make_arg<Context>(
          static_cast<int>(static_cast<TargetType>(value)));
      } else {
        typedef typename make_unsigned_or_bool<TargetType>::type Unsigned;
        arg_ = internal::make_arg<Context>(
          static_cast<unsigned>(static_cast<Unsigned>(value)));
      }
    } else {
      if (is_signed) {
        // glibc's printf doesn't sign extend arguments of smaller types:
        //   std::printf("%lld", -42);  // prints "4294967254"
        // but we don't have to do the same because it's a UB.
        arg_ = internal::make_arg<Context>(static_cast<long long>(value));
      } else {
        arg_ = internal::make_arg<Context>(
          static_cast<typename make_unsigned_or_bool<U>::type>(value));
      }
    }
  }